

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

uint8_t get_mask(int field)

{
  undefined8 in_RAX;
  undefined8 uVar1;
  undefined8 in_R9;
  
  uVar1 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
  if (field != 2) {
    if (field != 0x100) {
      fprintf(_stderr,"%s:%d: Unsupported field size %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/test_utils/./utils.h"
              ,0x1b,(ulong)(uint)field,in_R9,uVar1);
      exit(1);
    }
    uVar1 = 0xff;
  }
  return (uint8_t)uVar1;
}

Assistant:

UNUSED
static uint8_t get_mask(int field)
{
	switch(field) {
	case 2:		return 0x1;	break;
	case 256:	return 0xff;	break;
	default:
		fprintf(stderr, "%s:%d: Unsupported field size %d.\n",
			__FILE__, __LINE__, field);
		exit(EXIT_FAILURE);
	}
	return 0; // Not reached.
}